

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall QListModel::itemData(QListModel *this,QModelIndex *index)

{
  QListWidgetItem *pQVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  QMap<int,_QVariant> *this_00;
  const_reference ppQVar5;
  int *key;
  QModelIndex *in_RDX;
  long in_RSI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  in_RDI;
  int i;
  QListWidgetItem *itm;
  QMap<int,_QVariant> *roles;
  qsizetype in_stack_ffffffffffffff88;
  const_reference in_stack_ffffffffffffff90;
  int local_2c;
  
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)0x89a842);
  bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff90);
  if (bVar2) {
    iVar3 = QModelIndex::row(in_RDX);
    qVar4 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)(in_RSI + 0x10));
    if (iVar3 < qVar4) {
      this_00 = (QMap<int,_QVariant> *)(in_RSI + 0x10);
      QModelIndex::row(in_RDX);
      ppQVar5 = QList<QListWidgetItem_*>::at
                          ((QList<QListWidgetItem_*> *)in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88);
      pQVar1 = *ppQVar5;
      local_2c = 0;
      while( true ) {
        key = (int *)(long)local_2c;
        qVar4 = QList<QWidgetItemData>::size(&pQVar1->d->values);
        if (qVar4 <= (long)key) break;
        in_stack_ffffffffffffff90 =
             QList<QWidgetItemData>::at
                       ((QList<QWidgetItemData> *)in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88);
        QList<QWidgetItemData>::at
                  ((QList<QWidgetItemData> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        QMap<int,_QVariant>::insert(this_00,key,(QVariant *)in_stack_ffffffffffffff90);
        local_2c = local_2c + 1;
      }
    }
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

QMap<int, QVariant> QListModel::itemData(const QModelIndex &index) const
{
    QMap<int, QVariant> roles;
    if (!index.isValid() || index.row() >= items.size())
        return roles;
    QListWidgetItem *itm = items.at(index.row());
    for (int i = 0; i < itm->d->values.size(); ++i) {
        roles.insert(itm->d->values.at(i).role,
                     itm->d->values.at(i).value);
    }
    return roles;
}